

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_ManUpdate(Dam_Man_t *p,int iDiv)

{
  int *piVar1;
  uint iLit0;
  int iVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *vDivs;
  Gia_Obj_t *pGVar4;
  Vec_Flt_t *pVVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Gia_Obj_t *pFanout;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  float *pfVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int *piVar22;
  
  if (iDiv < 0) {
LAB_00707e76:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  pVVar11 = p->vHash->vObjs;
  uVar13 = iDiv * 4;
  if (pVVar11->nSize <= (int)uVar13) goto LAB_00707e76;
  pGVar3 = p->pGia;
  vDivs = pGVar3->vSuper;
  piVar22 = pVVar11->pArray;
  iLit0 = piVar22[uVar13];
  uVar13 = piVar22[(ulong)uVar13 + 1];
  if (iDiv < p->vDiv2Nod->nSize) {
    uVar7 = p->vDiv2Nod->pArray[(uint)iDiv];
    if ((ulong)uVar7 == 0) goto LAB_00707526;
    if (((int)uVar7 < 0) || (p->vNodStore->nSize <= (int)uVar7)) goto LAB_00707e76;
    piVar22 = p->vNodStore->pArray + uVar7;
  }
  else {
LAB_00707526:
    piVar22 = (int *)0x0;
  }
  pFanout = Gia_ManAppendObj(pGVar3);
  iVar18 = (int)pFanout;
  if ((int)uVar13 < (int)iLit0) {
    if ((int)iLit0 < 0) {
LAB_00707f30:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    uVar14 = iLit0 >> 1;
    uVar7 = pGVar3->nObjs;
    if ((int)uVar7 <= (int)uVar14) goto LAB_00707f30;
    if (((int)uVar13 < 0) || (uVar6 = uVar13 >> 1, uVar7 <= uVar6)) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    if (uVar14 == uVar6) {
      __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    pGVar4 = pGVar3->pObjs;
    if (uVar6 < uVar14) {
      if (pGVar4 + uVar7 <= pFanout || pFanout < pGVar4) goto LAB_00707f11;
      uVar10 = *(ulong *)pFanout;
      uVar20 = (ulong)((iLit0 & 1) << 0x1d |
                      ((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar14 & 0x1fffffff);
      *(ulong *)pFanout = uVar20 | uVar10 & 0xffffffffc0000000;
      pGVar4 = pGVar3->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar3->nObjs <= pFanout)) goto LAB_00707f11;
      uVar10 = (ulong)(uVar13 & 1) << 0x3d |
               uVar20 | uVar10 & 0xc0000000c0000000 |
               (ulong)(((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) <<
               0x20;
    }
    else {
      if (pGVar4 + uVar7 <= pFanout || pFanout < pGVar4) goto LAB_00707f11;
      uVar16 = (ulong)(((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar14 & 0x1fffffff) <<
               0x20;
      uVar10 = *(ulong *)pFanout;
      uVar20 = (ulong)(iLit0 & 1) << 0x3d;
      *(ulong *)pFanout = uVar20 | uVar10 & 0xc0000000ffffffff | uVar16;
      pGVar4 = pGVar3->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar3->nObjs <= pFanout)) goto LAB_00707f11;
      uVar10 = (ulong)((uVar13 & 1) << 0x1d) | uVar20 | uVar10 & 0xc0000000c0000000 | uVar16 |
               (ulong)(((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    }
    *(ulong *)pFanout = uVar10;
    pGVar3->nXors = pGVar3->nXors + 1;
  }
  else {
    if ((int)iLit0 < 0) {
LAB_00707f4f:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    uVar14 = iLit0 >> 1;
    uVar7 = pGVar3->nObjs;
    if ((int)uVar7 <= (int)uVar14) goto LAB_00707f4f;
    uVar6 = uVar13 >> 1;
    if (uVar7 <= uVar6) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if ((uVar14 == uVar6) && (pGVar3->fGiaSimple == 0)) {
      __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    pGVar4 = pGVar3->pObjs;
    if (iLit0 < uVar13) {
      if (pGVar4 + uVar7 <= pFanout || pFanout < pGVar4) goto LAB_00707f11;
      uVar10 = *(ulong *)pFanout;
      uVar20 = (ulong)((iLit0 & 1) << 0x1d |
                      ((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar14 & 0x1fffffff);
      *(ulong *)pFanout = uVar20 | uVar10 & 0xffffffffc0000000;
      pGVar4 = pGVar3->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar3->nObjs <= pFanout)) goto LAB_00707f11;
      uVar10 = (ulong)(uVar13 & 1) << 0x3d |
               uVar20 | uVar10 & 0xc0000000c0000000 |
               (ulong)(((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) <<
               0x20;
    }
    else {
      if (pGVar4 + uVar7 <= pFanout || pFanout < pGVar4) goto LAB_00707f11;
      uVar16 = (ulong)(((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar14 & 0x1fffffff) <<
               0x20;
      uVar10 = *(ulong *)pFanout;
      uVar20 = (ulong)(iLit0 & 1) << 0x3d;
      *(ulong *)pFanout = uVar20 | uVar10 & 0xc0000000ffffffff | uVar16;
      pGVar4 = pGVar3->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar3->nObjs <= pFanout)) goto LAB_00707f11;
      uVar10 = (ulong)((uVar13 & 1) << 0x1d) | uVar20 | uVar10 & 0xc0000000c0000000 | uVar16 |
               (ulong)(((uint)(iVar18 - (int)pGVar4) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    }
    *(ulong *)pFanout = uVar10;
    if (pGVar3->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pGVar3,pFanout + -(uVar10 & 0x1fffffff),pFanout);
      Gia_ObjAddFanout(pGVar3,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout)
      ;
    }
    if (pGVar3->fSweeper != 0) {
      uVar20 = *(ulong *)pFanout & 0x1fffffff;
      uVar10 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
      uVar16 = 0x4000000000000000;
      uVar17 = 0x4000000000000000;
      if (((uint)*(ulong *)(pFanout + -uVar20) >> 0x1e & 1) == 0) {
        uVar17 = 0x40000000;
      }
      *(ulong *)(pFanout + -uVar20) = uVar17 | *(ulong *)(pFanout + -uVar20);
      uVar17 = *(ulong *)(pFanout + -uVar10);
      if (((uint)uVar17 >> 0x1e & 1) == 0) {
        uVar16 = 0x40000000;
      }
      *(ulong *)(pFanout + -uVar10) = uVar16 | uVar17;
      uVar10 = *(ulong *)pFanout;
      *(ulong *)pFanout =
           uVar10 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar10 >> 0x3d) ^ (uint)(uVar17 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pFanout + -uVar20) >> 0x3f) ^
                  (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
    }
    if (pGVar3->fBuiltInSim != 0) {
      uVar10 = *(ulong *)pFanout;
      *(ulong *)pFanout =
           uVar10 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar10 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pFanout + -(uVar10 >> 0x20 & 0x1fffffff)) >> 0x3f))
                  & ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar10 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar10 >> 0x1d) & 7)) << 0x3f;
      pGVar4 = pGVar3->pObjs;
      if ((pFanout < pGVar4) || (pGVar4 + pGVar3->nObjs <= pFanout)) goto LAB_00707f11;
      Gia_ManBuiltInSimPerform
                (pGVar3,(int)((ulong)((long)pFanout - (long)pGVar4) >> 2) * -0x55555555);
    }
    if (pGVar3->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(pGVar3,pFanout);
    }
  }
  pGVar4 = pGVar3->pObjs;
  if ((pFanout < pGVar4) || (pGVar4 + pGVar3->nObjs <= pFanout)) {
LAB_00707f11:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar18 = (int)((long)pFanout - (long)pGVar4 >> 2);
  uVar7 = iVar18 * -0x55555555;
  iVar18 = iVar18 * 0x55555556;
  if (iVar18 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  pGVar3 = p->pGia;
  if (pGVar3->nObjs <= (int)(uVar7 & 0x7fffffff)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  Gia_ObjSetGateLevel(pGVar3,pGVar3->pObjs + (uVar7 & 0x7fffffff));
  if (*piVar22 < 2) {
    __assert_fail("pNods[0] >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x3b9,"void Dam_ManUpdate(Dam_Man_t *, int)");
  }
  pVVar11 = p->vHash->vObjs;
  iVar2 = pVVar11->nSize;
  iVar21 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar21 = iVar2;
  }
  vDivs->nSize = 0;
  if (*piVar22 < 1) {
    iVar15 = -1;
  }
  else {
    lVar19 = 0;
    iVar15 = 0;
    do {
      iVar8 = Dam_ManUpdateNode(p,piVar22[lVar19 + 1],iLit0,uVar13,iVar18,vDivs);
      iVar15 = iVar15 + iVar8;
      lVar19 = lVar19 + 1;
    } while (lVar19 < *piVar22);
    pVVar11 = p->vHash->vObjs;
    iVar15 = iVar15 + -1;
  }
  uVar7 = iVar21 >> 2;
  uVar10 = (ulong)uVar7;
  iVar18 = pVVar11->nSize;
  iVar21 = iVar18 + 3;
  if (-1 < iVar18) {
    iVar21 = iVar18;
  }
  iVar21 = iVar21 >> 2;
  pVVar5 = p->vCounts;
  uVar14 = pVVar5->nSize;
  if (iVar21 <= (int)uVar14) goto LAB_00707bcb;
  iVar18 = pVVar5->nCap;
  iVar8 = iVar18 * 2;
  if (iVar8 < iVar21) {
    if (iVar18 < iVar21) {
      if (pVVar5->pArray == (float *)0x0) {
        pfVar12 = (float *)malloc((long)iVar21 << 2);
      }
      else {
        pfVar12 = (float *)realloc(pVVar5->pArray,(long)iVar21 << 2);
      }
      pVVar5->pArray = pfVar12;
      iVar8 = iVar21;
LAB_00707b9c:
      pVVar5->nCap = iVar8;
      uVar14 = pVVar5->nSize;
    }
  }
  else if (iVar18 < iVar21) {
    if (pVVar5->pArray == (float *)0x0) {
      pfVar12 = (float *)malloc((long)iVar18 << 3);
    }
    else {
      pfVar12 = (float *)realloc(pVVar5->pArray,(long)iVar18 << 3);
    }
    pVVar5->pArray = pfVar12;
    goto LAB_00707b9c;
  }
  if ((int)uVar14 < iVar21) {
    memset(pVVar5->pArray + (int)uVar14,0,(ulong)(~uVar14 + iVar21) * 4 + 4);
  }
  pVVar5->nSize = iVar21;
LAB_00707bcb:
  Vec_IntFillExtra(p->vDiv2Nod,iVar21,-1);
  if ((int)uVar7 < iVar21) {
    uVar14 = uVar7 * 4;
    uVar20 = uVar10;
    do {
      if ((iVar2 < -3) || (pVVar11 = p->vHash->vObjs, pVVar11->nSize <= (int)uVar14))
      goto LAB_00707e76;
      piVar22 = pVVar11->pArray;
      iVar18 = piVar22[(ulong)uVar14 + 2];
      if (1 < iVar18) {
        iVar8 = (int)uVar20;
        if (p->vDivLevR->nSize <= iVar8) goto LAB_00707e95;
        pVVar5 = p->vCounts;
        iVar9 = Dam_ManDivSlack(p,piVar22[uVar14],piVar22[(ulong)uVar14 + 1],
                                p->vDivLevR->pArray[uVar20]);
        if (pVVar5->nSize <= iVar8) goto LAB_00707ed3;
        pVVar5->pArray[uVar20] = (float)iVar9 * 0.001 + (float)iVar18;
        Vec_QuePush(p->vQue,iVar8);
        if (p->vDiv2Nod->nSize <= iVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar11 = p->vNodStore;
        p->vDiv2Nod->pArray[uVar20] = pVVar11->nSize;
        Vec_IntPush(pVVar11,0);
        Vec_IntFillExtra(p->vNodStore,iVar18 + p->vNodStore->nSize,-1);
      }
      uVar20 = uVar20 + 1;
      uVar14 = uVar14 + 4;
    } while ((int)uVar20 < iVar21);
  }
  iVar18 = vDivs->nSize;
  if (0 < iVar18) {
    piVar22 = vDivs->pArray;
    iVar8 = -1;
    lVar19 = 0;
    do {
      iVar9 = piVar22[lVar19];
      if ((long)iVar9 < 0) {
        iVar8 = -iVar9;
      }
      else {
        if (p->vDiv2Nod->nSize <= iVar9) goto LAB_00707e95;
        uVar14 = p->vDiv2Nod->pArray[iVar9];
        if ((ulong)uVar14 != 0xffffffff) {
          if (((int)uVar14 < 0) || (p->vNodStore->nSize <= (int)uVar14)) goto LAB_00707e76;
          piVar1 = p->vNodStore->pArray + uVar14;
          iVar18 = *piVar1;
          *piVar1 = iVar18 + 1;
          piVar1[(long)iVar18 + 1] = iVar8;
          iVar18 = vDivs->nSize;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar18);
  }
  if ((int)uVar7 < iVar21) {
    uVar7 = uVar7 << 2;
    do {
      if ((iVar2 < -3) || (p->vDiv2Nod->nSize <= (int)uVar10)) {
LAB_00707e95:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar18 = p->vDiv2Nod->pArray[uVar10];
      if (0 < (long)iVar18) {
        if ((p->vNodStore->nSize <= iVar18) ||
           (pVVar11 = p->vHash->vObjs, pVVar11->nSize <= (int)uVar7)) goto LAB_00707e76;
        if (p->vNodStore->pArray[iVar18] != pVVar11->pArray[(ulong)uVar7 + 2]) {
          __assert_fail("Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x3e2,"void Dam_ManUpdate(Dam_Man_t *, int)");
        }
      }
      uVar10 = uVar10 + 1;
      uVar7 = uVar7 + 4;
    } while ((int)uVar10 < iVar21);
  }
  if (iDiv < p->vCounts->nSize) {
    p->vCounts->pArray[(uint)iDiv] = 0.0;
    p->nGain = p->nGain + ((uint)((int)uVar13 < (int)iLit0) * 2 + 1) * iVar15;
    p->nGainX = p->nGainX + (uint)((int)uVar13 < (int)iLit0) * iVar15 * 3;
    p->nDivs = p->nDivs + 1;
    return;
  }
LAB_00707ed3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
}

Assistant:

void Dam_ManUpdate( Dam_Man_t * p, int iDiv )
{
    Vec_Int_t * vDivs = p->pGia->vSuper;
    int iLit0 = Hash_IntObjData0(p->vHash, iDiv);
    int iLit1 = Hash_IntObjData1(p->vHash, iDiv);
    int i, iLitNew, * pSet, * pNods = Dam_DivSet( p, iDiv );
    int nPresent = 0, nPairsStart, nPairsStop, pPairsNew, nRefs;
    int fThisIsXor = (iLit0 > iLit1), iDivTemp, iNode;
//    Dam_PrintQue( p );
    if ( fThisIsXor )
        iLitNew = Gia_ManAppendXorReal( p->pGia, iLit0, iLit1 );
    else
        iLitNew = Gia_ManAppendAnd( p->pGia, iLit0, iLit1 );
    Gia_ObjSetGateLevel( p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew)) );
//    printf( "%d ", Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew))) );
    // replace entries
    assert( pNods[0] >= 2 );
    nPairsStart = Hash_IntManEntryNum(p->vHash) + 1;
    Vec_IntClear( vDivs );
    for ( i = 1; i <= pNods[0]; i++ )
        nPresent += Dam_ManUpdateNode( p, pNods[i], iLit0, iLit1, iLitNew, vDivs );
    nPairsStop = Hash_IntManEntryNum(p->vHash) + 1;
    // extend arrayvs
    pPairsNew = 0;
    Vec_FltFillExtra( p->vCounts, nPairsStop, 0 );
    Vec_IntFillExtra( p->vDiv2Nod, nPairsStop, -1 );
    for ( i = nPairsStart; i < nPairsStop; i++ )
    {
        nRefs = Hash_IntObjData2(p->vHash, i);
        if ( nRefs < 2 )
            continue;
        Vec_FltWriteEntry( p->vCounts, i, nRefs + 0.001*Dam_ManDivSlack(p, Hash_IntObjData0(p->vHash, i), Hash_IntObjData1(p->vHash, i), Vec_IntEntry(p->vDivLevR, i)) );
        Vec_QuePush( p->vQue, i );
        // remember divisors
        Vec_IntWriteEntry( p->vDiv2Nod, i, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        pPairsNew++;
    }
//    printf( "Added %d new pairs\n", pPairsNew );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDivTemp, i )
    {
        if ( iDivTemp < 0 )
        {
            iNode = -iDivTemp;
            continue;
        }
        if ( Vec_IntEntry(p->vDiv2Nod, iDivTemp) == -1 )
            continue;
        pSet = Dam_DivSet( p, iDivTemp );
        pSet[++pSet[0]] = iNode;
    }
    // make sure divisors are added correctly
    for ( i = nPairsStart; i < nPairsStop; i++ )
        if ( Vec_IntEntry(p->vDiv2Nod, i) > 0 )
            assert( Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i) );
    // update costs
    Vec_FltWriteEntry( p->vCounts, iDiv, 0 );
    p->nGain += (1 + 2 * fThisIsXor) * (nPresent - 1);
    p->nGainX += 3 * fThisIsXor * (nPresent - 1);
    p->nDivs++;
}